

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cMultiBindTests.cpp
# Opt level: O1

void __thiscall gl4cts::MultiBind::Texture::Init(Texture *this,Context *context)

{
  int iVar1;
  undefined4 extraout_var;
  
  if (this->m_id != 0xffffffff) {
    iVar1 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x480))(1,this);
    this->m_id = 0xffffffff;
  }
  this->m_context = context;
  return;
}

Assistant:

void Texture::Init(deqp::Context& context)
{
	Release();

	m_context = &context;
}